

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionInvert(Quaternion q)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  Quaternion QVar9;
  undefined8 uVar5;
  
  uVar5 = q._8_8_;
  uVar2 = q._0_8_;
  fVar4 = q.z;
  fVar6 = q.w;
  fVar1 = q.x;
  fVar3 = q.y;
  fVar7 = fVar6 * fVar6 + fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar8 = -(1.0 / fVar7);
    uVar2 = CONCAT44(fVar3 * fVar8,fVar1 * fVar8);
    uVar5 = CONCAT44(fVar6 * (1.0 / fVar7),fVar4 * fVar8);
  }
  QVar9.z = (float)(int)uVar5;
  QVar9.w = (float)(int)((ulong)uVar5 >> 0x20);
  QVar9.x = (float)(int)uVar2;
  QVar9.y = (float)(int)((ulong)uVar2 >> 0x20);
  return QVar9;
}

Assistant:

RMAPI Quaternion QuaternionInvert(Quaternion q)
{
    Quaternion result = q;

    float lengthSq = q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w;

    if (lengthSq != 0.0f)
    {
        float invLength = 1.0f/lengthSq;

        result.x *= -invLength;
        result.y *= -invLength;
        result.z *= -invLength;
        result.w *= invLength;
    }

    return result;
}